

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O2

Data * DL::Expressions::print_func(Data *__return_storage_ptr__,vector_t<Data> *args,VM *vm)

{
  pointer pDVar1;
  SourceLogger *pSVar2;
  Data *d;
  pointer d_00;
  allocator local_1d1;
  string_t local_1d0;
  stringstream stream;
  
  std::__cxx11::stringstream::stringstream((stringstream *)&stream);
  pDVar1 = (args->super__Vector_base<DL::Data,_std::allocator<DL::Data>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (d_00 = (args->super__Vector_base<DL::Data,_std::allocator<DL::Data>_>)._M_impl.
              super__Vector_impl_data._M_start; d_00 != pDVar1; d_00 = d_00 + 1) {
    print_val(d_00,&stream);
  }
  pSVar2 = vm->mLogger;
  std::__cxx11::stringbuf::str();
  (*pSVar2->_vptr_SourceLogger[3])(pSVar2,1,&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::string((string *)&local_1d0,"",&local_1d1);
  Data::Data(__return_storage_ptr__,&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
  return __return_storage_ptr__;
}

Assistant:

Data print_func(const vector_t<Data>& args, VM& vm)
{
	std::stringstream stream;

	for (const Data& d : args)
		print_val(d, stream);

	vm.logger()->log(L_Info, stream.str());
	return Data();
}